

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDFace::SharpEdgeCount(ON_SubDFace *this)

{
  bool bVar1;
  ON_SubDEdge *this_00;
  ON_SubDEdge *e;
  ON_SubDEdgePtr *pOStack_20;
  unsigned_short fei;
  ON_SubDEdgePtr *eptr;
  uint sharp_edge_count;
  ON_SubDFace *this_local;
  
  eptr._4_4_ = 0;
  pOStack_20 = this->m_edge4;
  e._6_2_ = 0;
  while ((e._6_2_ < this->m_edge_count &&
         ((e._6_2_ != 4 || (pOStack_20 = this->m_edgex, pOStack_20 != (ON_SubDEdgePtr *)0x0))))) {
    this_00 = (ON_SubDEdge *)(pOStack_20->m_ptr & 0xfffffffffffffff8);
    if ((this_00 != (ON_SubDEdge *)0x0) && (bVar1 = ON_SubDEdge::IsSharp(this_00), bVar1)) {
      eptr._4_4_ = eptr._4_4_ + 1;
    }
    e._6_2_ = e._6_2_ + 1;
    pOStack_20 = pOStack_20 + 1;
  }
  return eptr._4_4_;
}

Assistant:

unsigned int ON_SubDFace::SharpEdgeCount() const
{
  unsigned int sharp_edge_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr != e && e->IsSharp())
      ++sharp_edge_count;
  }
  return sharp_edge_count;
}